

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O2

void __thiscall
llvm::Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
~Expected(Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
          *this)

{
  error_type *this_00;
  _Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_> *this_01;
  
  if ((this->field_0x18 & 1) != 0) {
    this_00 = getErrorStorage(this);
    std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::~unique_ptr
              (this_00);
    return;
  }
  this_01 = &getStorage(this)->
             super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>;
  std::_Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::
  ~_Vector_base(this_01);
  return;
}

Assistant:

~Expected() {
    assertIsChecked();
    if (!HasError)
      getStorage()->~storage_type();
    else
      getErrorStorage()->~error_type();
  }